

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5VocabBestIndexMethod(sqlite3_vtab *pUnused,sqlite3_index_info *pInfo)

{
  uchar uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uchar *puVar9;
  ulong uVar10;
  
  if ((long)pInfo->nConstraint < 1) {
    uVar6 = 0xffffffff;
    uVar3 = 0xffffffff;
    uVar2 = 0xffffffff;
  }
  else {
    puVar9 = &pInfo->aConstraint->usable;
    uVar2 = 0xffffffff;
    uVar10 = 0;
    uVar5 = 0xffffffff;
    uVar7 = 0xffffffff;
    do {
      if ((*puVar9 != '\0') && (((sqlite3_index_constraint *)(puVar9 + -5))->iColumn == 0)) {
        uVar1 = puVar9[-1];
        if (uVar1 == '\x02') {
          uVar7 = uVar10 & 0xffffffff;
        }
        if ((uVar1 - 8 & 0xf7) == 0) {
          uVar2 = uVar10 & 0xffffffff;
        }
        if (uVar1 == ' ') {
          uVar5 = uVar10 & 0xffffffff;
        }
        if (uVar1 == '\x04') {
          uVar5 = uVar10 & 0xffffffff;
        }
      }
      uVar3 = (uint)uVar5;
      uVar6 = (uint)uVar7;
      uVar10 = uVar10 + 1;
      puVar9 = puVar9 + 0xc;
    } while ((long)pInfo->nConstraint != uVar10);
  }
  uVar8 = (uint)pInfo->colUsed;
  if ((int)uVar6 < 0) {
    pInfo->estimatedCost = 1000000.0;
    if ((int)uVar3 < 0) {
      iVar4 = 1;
    }
    else {
      uVar8 = uVar8 | 0x200;
      pInfo->aConstraintUsage[uVar3].argvIndex = 1;
      pInfo->estimatedCost = 500000.0;
      iVar4 = 2;
    }
    if (-1 < (int)uVar2) {
      uVar8 = uVar8 | 0x400;
      pInfo->aConstraintUsage[uVar2].argvIndex = iVar4;
      pInfo->estimatedCost = pInfo->estimatedCost * 0.5;
    }
  }
  else {
    uVar8 = uVar8 | 0x100;
    pInfo->aConstraintUsage[uVar6].argvIndex = 1;
    pInfo->estimatedCost = 100.0;
  }
  if (((pInfo->nOrderBy == 1) && (pInfo->aOrderBy->iColumn == 0)) && (pInfo->aOrderBy->desc == '\0')
     ) {
    pInfo->orderByConsumed = 1;
  }
  pInfo->idxNum = uVar8;
  return 0;
}

Assistant:

static int fts5VocabBestIndexMethod(
  sqlite3_vtab *pUnused,
  sqlite3_index_info *pInfo
){
  int i;
  int iTermEq = -1;
  int iTermGe = -1;
  int iTermLe = -1;
  int idxNum = (int)pInfo->colUsed;
  int nArg = 0;

  UNUSED_PARAM(pUnused);

  assert( (pInfo->colUsed & FTS5_VOCAB_COLUSED_MASK)==pInfo->colUsed );

  for(i=0; i<pInfo->nConstraint; i++){
    struct sqlite3_index_constraint *p = &pInfo->aConstraint[i];
    if( p->usable==0 ) continue;
    if( p->iColumn==0 ){          /* term column */
      if( p->op==SQLITE_INDEX_CONSTRAINT_EQ ) iTermEq = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LE ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LT ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GE ) iTermGe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GT ) iTermGe = i;
    }
  }

  if( iTermEq>=0 ){
    idxNum |= FTS5_VOCAB_TERM_EQ;
    pInfo->aConstraintUsage[iTermEq].argvIndex = ++nArg;
    pInfo->estimatedCost = 100;
  }else{
    pInfo->estimatedCost = 1000000;
    if( iTermGe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_GE;
      pInfo->aConstraintUsage[iTermGe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
    if( iTermLe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_LE;
      pInfo->aConstraintUsage[iTermLe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
  }

  /* This virtual table always delivers results in ascending order of
  ** the "term" column (column 0). So if the user has requested this
  ** specifically - "ORDER BY term" or "ORDER BY term ASC" - set the
  ** sqlite3_index_info.orderByConsumed flag to tell the core the results
  ** are already in sorted order.  */
  if( pInfo->nOrderBy==1
   && pInfo->aOrderBy[0].iColumn==0
   && pInfo->aOrderBy[0].desc==0
  ){
    pInfo->orderByConsumed = 1;
  }

  pInfo->idxNum = idxNum;
  return SQLITE_OK;
}